

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg.cc
# Opt level: O2

bool absl::lts_20250127::str_format_internal::ConvertIntArg<absl::lts_20250127::int128>
               (int128 v,FormatConversionSpecImpl conv,FormatSinkImpl *sink)

{
  ulong uVar1;
  bool bVar2;
  uint in_ECX;
  uint uVar3;
  uint64_t uVar4;
  uint64_t uVar5;
  ulong uVar6;
  FormatSinkImpl *in_R8;
  FormatSinkImpl *pFVar7;
  double v_00;
  uint128 v_01;
  uint128 v_02;
  string_view v_03;
  uint128 v_04;
  uint128 v_05;
  FormatConversionSpecImpl conv_00;
  FormatConversionSpecImpl conv_01;
  FormatConversionSpecImpl conv_02;
  FormatSinkImpl *local_68 [2];
  IntDigits local_58;
  
  uVar5 = CONCAT44((int)((ulong)register0x00000030 >> 0x20),conv.precision_);
  uVar6 = conv._0_8_;
  conv_02.width_ = 0;
  conv_02._0_4_ = in_ECX;
  conv_01.precision_ = (int)in_R8;
  pFVar7 = in_R8;
  local_68[0] = sink;
  switch((ulong)sink & 0xff) {
  case 0:
    uVar3 = (wchar_t)sink & 0xff0000;
    if (uVar3 != 0x20000) {
      conv_00.precision_ = conv_01.precision_;
      conv_00._0_8_ = sink;
      anon_unknown_53::ConvertCharImpl(conv.conv_,conv_00,(FormatSinkImpl *)(ulong)uVar3);
      return true;
    }
    conv_02.precision_ = conv_01.precision_;
    bVar2 = anon_unknown_53::ConvertWCharTImpl
                      ((anon_unknown_53 *)(uVar6 & 0xffffffff),(wchar_t)sink,conv_02,in_R8);
    return bVar2;
  default:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/strings/internal/str_format/arg.cc"
                  ,0x1c2,
                  "bool absl::str_format_internal::ConvertIntArg(T, FormatConversionSpecImpl, FormatSinkImpl *) [T = absl::int128]"
                 );
  case 2:
  case 3:
  case 0x12:
    uVar4 = -(ulong)(uVar6 != 0) - uVar5;
    uVar1 = -uVar6;
    if (-1 < register0x00000030) {
      uVar4 = uVar5;
      uVar1 = uVar6;
    }
    uVar6 = uVar1;
    bVar2 = SUB81((ulong)register0x00000030 >> 0x3f,0);
    uVar5 = uVar4;
    goto LAB_0030a846;
  case 4:
    v_01.hi_ = uVar5;
    v_01.lo_ = uVar6;
    anon_unknown_53::IntDigits::PrintAsOct<absl::lts_20250127::uint128>(&local_58,v_01);
    break;
  case 5:
    bVar2 = false;
LAB_0030a846:
    v_02.hi_ = uVar5;
    v_02.lo_ = uVar6;
    anon_unknown_53::IntDigits::PrintAsDec(&local_58,v_02,bVar2);
    break;
  case 6:
    v_05.hi_ = uVar5;
    v_05.lo_ = uVar6;
    anon_unknown_53::IntDigits::PrintAsHexLower<absl::lts_20250127::uint128>(&local_58,v_05);
    break;
  case 7:
    v_04.hi_ = uVar5;
    v_04.lo_ = uVar6;
    anon_unknown_53::IntDigits::PrintAsHexUpper<absl::lts_20250127::uint128>(&local_58,v_04);
    break;
  case 8:
  case 9:
  case 10:
  case 0xb:
  case 0xc:
  case 0xd:
  case 0xe:
  case 0xf:
    v_00 = (double)__floattidf(uVar6,uVar5);
    bVar2 = ConvertFloatImpl(v_00,(FormatConversionSpecImpl *)local_68,in_R8);
    return bVar2;
  }
  if (((ulong)sink & 0xff00) == 0) {
    v_03._M_str = local_58.start_;
    v_03._M_len = local_58.size_;
    FormatSinkImpl::Append(in_R8,v_03);
  }
  else {
    conv_01.conv_ = (char)in_ECX;
    conv_01.flags_ = (char)(in_ECX >> 8);
    conv_01.length_mod_ = (char)(in_ECX >> 0x10);
    conv_01._3_1_ = (char)(in_ECX >> 0x18);
    conv_01.width_ = 0;
    anon_unknown_53::ConvertIntImplInnerSlow
              ((anon_unknown_53 *)&local_58,(IntDigits *)sink,conv_01,pFVar7);
  }
  return true;
}

Assistant:

bool ConvertIntArg(T v, FormatConversionSpecImpl conv, FormatSinkImpl *sink) {
  using U = typename MakeUnsigned<T>::type;
  IntDigits as_digits;

  // This odd casting is due to a bug in -Wswitch behavior in gcc49 which causes
  // it to complain about a switch/case type mismatch, even though both are
  // FormatConversionChar.  Likely this is because at this point
  // FormatConversionChar is declared, but not defined.
  switch (static_cast<uint8_t>(conv.conversion_char())) {
    case static_cast<uint8_t>(FormatConversionCharInternal::c):
      return (std::is_same<T, wchar_t>::value ||
              (conv.length_mod() == LengthMod::l))
                 ? ConvertWCharTImpl(static_cast<wchar_t>(v), conv, sink)
                 : ConvertCharImpl(static_cast<char>(v), conv, sink);

    case static_cast<uint8_t>(FormatConversionCharInternal::o):
      as_digits.PrintAsOct(static_cast<U>(v));
      break;

    case static_cast<uint8_t>(FormatConversionCharInternal::x):
      as_digits.PrintAsHexLower(static_cast<U>(v));
      break;
    case static_cast<uint8_t>(FormatConversionCharInternal::X):
      as_digits.PrintAsHexUpper(static_cast<U>(v));
      break;

    case static_cast<uint8_t>(FormatConversionCharInternal::u):
      as_digits.PrintAsDec(static_cast<U>(v));
      break;

    case static_cast<uint8_t>(FormatConversionCharInternal::d):
    case static_cast<uint8_t>(FormatConversionCharInternal::i):
    case static_cast<uint8_t>(FormatConversionCharInternal::v):
      as_digits.PrintAsDec(v);
      break;

    case static_cast<uint8_t>(FormatConversionCharInternal::a):
    case static_cast<uint8_t>(FormatConversionCharInternal::e):
    case static_cast<uint8_t>(FormatConversionCharInternal::f):
    case static_cast<uint8_t>(FormatConversionCharInternal::g):
    case static_cast<uint8_t>(FormatConversionCharInternal::A):
    case static_cast<uint8_t>(FormatConversionCharInternal::E):
    case static_cast<uint8_t>(FormatConversionCharInternal::F):
    case static_cast<uint8_t>(FormatConversionCharInternal::G):
      return ConvertFloatImpl(static_cast<double>(v), conv, sink);

    default:
      ABSL_ASSUME(false);
  }

  if (conv.is_basic()) {
    sink->Append(as_digits.with_neg_and_zero());
    return true;
  }
  return ConvertIntImplInnerSlow(as_digits, conv, sink);
}